

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCreateIntSubset(void)

{
  int iVar1;
  int iVar2;
  xmlDocPtr val;
  xmlChar *val_00;
  xmlChar *val_01;
  xmlChar *val_02;
  xmlDtdPtr val_03;
  int local_54;
  int n_SystemID;
  xmlChar *SystemID;
  int n_ExternalID;
  xmlChar *ExternalID;
  int n_name;
  xmlChar *name;
  int n_doc;
  xmlDocPtr doc;
  xmlDtdPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (name._4_4_ = 0; (int)name._4_4_ < 4; name._4_4_ = name._4_4_ + 1) {
    for (ExternalID._4_4_ = 0; (int)ExternalID._4_4_ < 5; ExternalID._4_4_ = ExternalID._4_4_ + 1) {
      for (SystemID._4_4_ = 0; (int)SystemID._4_4_ < 5; SystemID._4_4_ = SystemID._4_4_ + 1) {
        for (local_54 = 0; local_54 < 5; local_54 = local_54 + 1) {
          iVar1 = xmlMemBlocks();
          val = gen_xmlDocPtr(name._4_4_,0);
          val_00 = gen_const_xmlChar_ptr(ExternalID._4_4_,1);
          val_01 = gen_const_xmlChar_ptr(SystemID._4_4_,2);
          val_02 = gen_const_xmlChar_ptr(local_54,3);
          val_03 = (xmlDtdPtr)xmlCreateIntSubset(val,val_00,val_01,val_02);
          desret_xmlDtdPtr(val_03);
          call_tests = call_tests + 1;
          des_xmlDocPtr(name._4_4_,val,0);
          des_const_xmlChar_ptr(ExternalID._4_4_,val_00,1);
          des_const_xmlChar_ptr(SystemID._4_4_,val_01,2);
          des_const_xmlChar_ptr(local_54,val_02,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlCreateIntSubset",(ulong)(uint)(iVar2 - iVar1));
            ret_val._4_4_ = ret_val._4_4_ + 1;
            printf(" %d",(ulong)name._4_4_);
            printf(" %d",(ulong)ExternalID._4_4_);
            printf(" %d",(ulong)SystemID._4_4_);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlCreateIntSubset(void) {
    int test_ret = 0;

    int mem_base;
    xmlDtdPtr ret_val;
    xmlDocPtr doc; /* the document pointer (optional) */
    int n_doc;
    const xmlChar * name; /* the DTD name (optional) */
    int n_name;
    const xmlChar * ExternalID; /* the external (PUBLIC) ID (optional) */
    int n_ExternalID;
    const xmlChar * SystemID; /* the system ID (optional) */
    int n_SystemID;

    for (n_doc = 0;n_doc < gen_nb_xmlDocPtr;n_doc++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
    for (n_ExternalID = 0;n_ExternalID < gen_nb_const_xmlChar_ptr;n_ExternalID++) {
    for (n_SystemID = 0;n_SystemID < gen_nb_const_xmlChar_ptr;n_SystemID++) {
        mem_base = xmlMemBlocks();
        doc = gen_xmlDocPtr(n_doc, 0);
        name = gen_const_xmlChar_ptr(n_name, 1);
        ExternalID = gen_const_xmlChar_ptr(n_ExternalID, 2);
        SystemID = gen_const_xmlChar_ptr(n_SystemID, 3);

        ret_val = xmlCreateIntSubset(doc, name, ExternalID, SystemID);
        desret_xmlDtdPtr(ret_val);
        call_tests++;
        des_xmlDocPtr(n_doc, doc, 0);
        des_const_xmlChar_ptr(n_name, name, 1);
        des_const_xmlChar_ptr(n_ExternalID, ExternalID, 2);
        des_const_xmlChar_ptr(n_SystemID, SystemID, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlCreateIntSubset",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_doc);
            printf(" %d", n_name);
            printf(" %d", n_ExternalID);
            printf(" %d", n_SystemID);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}